

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O0

Mat * __thiscall ncnn::Mat::operator=(Mat *this,Mat *m)

{
  int *piVar1;
  Mat *in_RSI;
  Mat *in_RDI;
  int in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  if (in_RDI != in_RSI) {
    if (in_RSI->refcount != (int *)0x0) {
      piVar1 = in_RSI->refcount;
      in_stack_ffffffffffffffe4 = 1;
      LOCK();
      in_stack_ffffffffffffffe0 = *piVar1;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    release((Mat *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    in_RDI->data = in_RSI->data;
    in_RDI->refcount = in_RSI->refcount;
    in_RDI->elemsize = in_RSI->elemsize;
    in_RDI->elempack = in_RSI->elempack;
    in_RDI->allocator = in_RSI->allocator;
    in_RDI->dims = in_RSI->dims;
    in_RDI->w = in_RSI->w;
    in_RDI->h = in_RSI->h;
    in_RDI->c = in_RSI->c;
    in_RDI->cstep = in_RSI->cstep;
  }
  return in_RDI;
}

Assistant:

inline Mat& Mat::operator=(const Mat& m)
{
    if (this == &m)
        return *this;

    if (m.refcount)
        NCNN_XADD(m.refcount, 1);

    release();

    data = m.data;
    refcount = m.refcount;
    elemsize = m.elemsize;
    elempack = m.elempack;
    allocator = m.allocator;

    dims = m.dims;
    w = m.w;
    h = m.h;
    c = m.c;

    cstep = m.cstep;

    return *this;
}